

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuRandomParamsHolder,_iutest::detail::iuParamGenerator<bool>_>::
params_t<int>::append(params_t<int> *this,IParamGenerater *gen)

{
  int iVar1;
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_> p;
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_> local_20;
  int local_14;
  
  local_20.m_ptr = gen;
  (*gen->_vptr_iuIParamGenerator[2])(gen);
  while( true ) {
    iVar1 = (*(local_20.m_ptr)->_vptr_iuIParamGenerator[5])();
    if ((char)iVar1 != '\0') break;
    local_14 = (*(local_20.m_ptr)->_vptr_iuIParamGenerator[3])();
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->val,&local_14);
    (*(local_20.m_ptr)->_vptr_iuIParamGenerator[4])();
  }
  scoped_ptr<iutest::detail::iuIParamGenerator<int>_>::~scoped_ptr(&local_20);
  return;
}

Assistant:

void append(IParamGenerater* gen)
        {
            detail::scoped_ptr<IParamGenerater> p(gen);
            for( p->Begin(); !p->IsEnd(); p->Next() )
            {
                val.push_back(p->GetCurrent());
            }
        }